

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool *pool)

{
  int cid;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < pool->totalCCtx; lVar1 = lVar1 + 1) {
    ZSTD_freeCCtx(pool->cctx[lVar1]);
  }
  pthread_mutex_destroy((pthread_mutex_t *)pool);
  ZSTD_customFree(pool,pool->cMem);
  return;
}

Assistant:

static void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool* pool)
{
    int cid;
    for (cid=0; cid<pool->totalCCtx; cid++)
        ZSTD_freeCCtx(pool->cctx[cid]);  /* note : compatible with free on NULL */
    ZSTD_pthread_mutex_destroy(&pool->poolMutex);
    ZSTD_customFree(pool, pool->cMem);
}